

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVProcessChain.cxx
# Opt level: O0

void printResults(vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                  *actual,vector<ExpectedStatus,_std::allocator<ExpectedStatus>_> *expected)

{
  bool bVar1;
  ostream *poVar2;
  reference ppSVar3;
  void *this;
  Status **a;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
  *__range1_1;
  function<std::basic_ostream<char,_std::char_traits<char>_>_&(std::basic_ostream<char,_std::char_traits<char>_>_&)>
  local_58;
  reference local_38;
  ExpectedStatus *e;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ExpectedStatus,_std::allocator<ExpectedStatus>_> *__range1;
  vector<ExpectedStatus,_std::allocator<ExpectedStatus>_> *expected_local;
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
  *actual_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Expected: ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<ExpectedStatus,_std::allocator<ExpectedStatus>_>::begin(expected);
  e = (ExpectedStatus *)std::vector<ExpectedStatus,_std::allocator<ExpectedStatus>_>::end(expected);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_ExpectedStatus_*,_std::vector<ExpectedStatus,_std::allocator<ExpectedStatus>_>_>
                                *)&e);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<const_ExpectedStatus_*,_std::vector<ExpectedStatus,_std::allocator<ExpectedStatus>_>_>
               ::operator*(&__end1);
    if ((local_38->Finished & 1U) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"  null");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"  ExitStatus: ");
      printExpected<long>(&local_58,(bool)(local_38->MatchExitStatus & 1),
                          &(local_38->Status).ExitStatus);
      poVar2 = operator<<(poVar2,&local_58);
      poVar2 = std::operator<<(poVar2,", TermSignal: ");
      printExpected<int>((function<std::basic_ostream<char,_std::char_traits<char>_>_&(std::basic_ostream<char,_std::char_traits<char>_>_&)>
                          *)&__range1_1,(bool)(local_38->MatchTermSignal & 1),
                         &(local_38->Status).TermSignal);
      poVar2 = operator<<(poVar2,(function<std::basic_ostream<char,_std::char_traits<char>_>_&(std::basic_ostream<char,_std::char_traits<char>_>_&)>
                                  *)&__range1_1);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::
      function<std::basic_ostream<char,_std::char_traits<char>_>_&(std::basic_ostream<char,_std::char_traits<char>_>_&)>
      ::~function((function<std::basic_ostream<char,_std::char_traits<char>_>_&(std::basic_ostream<char,_std::char_traits<char>_>_&)>
                   *)&__range1_1);
      std::
      function<std::basic_ostream<char,_std::char_traits<char>_>_&(std::basic_ostream<char,_std::char_traits<char>_>_&)>
      ::~function(&local_58);
    }
    __gnu_cxx::
    __normal_iterator<const_ExpectedStatus_*,_std::vector<ExpectedStatus,_std::allocator<ExpectedStatus>_>_>
    ::operator++(&__end1);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Actual:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __end1_1 = std::
             vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
             ::begin(actual);
  a = (Status **)
      std::
      vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>::
      end(actual);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_cmUVProcessChain::Status_*const_*,_std::vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>_>
                        *)&a);
    if (!bVar1) break;
    ppSVar3 = __gnu_cxx::
              __normal_iterator<const_cmUVProcessChain::Status_*const_*,_std::vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>_>
              ::operator*(&__end1_1);
    if (*ppSVar3 == (Status *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"  null");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"  ExitStatus: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(*ppSVar3)->ExitStatus);
      poVar2 = std::operator<<(poVar2,", TermSignal: ");
      this = (void *)std::ostream::operator<<(poVar2,(*ppSVar3)->TermSignal);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    __gnu_cxx::
    __normal_iterator<const_cmUVProcessChain::Status_*const_*,_std::vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

static void printResults(
  const std::vector<const cmUVProcessChain::Status*>& actual,
  const std::vector<ExpectedStatus>& expected)
{
  std::cout << "Expected: " << std::endl;
  for (auto const& e : expected) {
    if (e.Finished) {
      std::cout << "  ExitStatus: "
                << printExpected(e.MatchExitStatus, e.Status.ExitStatus)
                << ", TermSignal: "
                << printExpected(e.MatchTermSignal, e.Status.TermSignal)
                << std::endl;
    } else {
      std::cout << "  null" << std::endl;
    }
  }
  std::cout << "Actual:" << std::endl;
  for (auto const& a : actual) {
    if (a) {
      std::cout << "  ExitStatus: " << a->ExitStatus
                << ", TermSignal: " << a->TermSignal << std::endl;
    } else {
      std::cout << "  null" << std::endl;
    }
  }
}